

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O2

word If_ManSat6Truth(word uBound,word uFree,int *pBSet,int nBSet,int *pSSet,int nSSet,int *pFSet,
                    int nFSet)

{
  ulong uVar1;
  word wVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ushort local_60;
  word f [4];
  
  uVar1 = 0;
  uVar6 = (ulong)(uint)nSSet;
  if (nSSet < 1) {
    uVar6 = uVar1;
  }
  for (; uVar6 != uVar1; uVar1 = uVar1 + 1) {
    f[uVar1] = s_Truths6[pSSet[uVar1]];
  }
  uVar5 = 0;
  uVar1 = uVar6;
  uVar3 = (ulong)(uint)nBSet;
  if (nBSet < 1) {
    uVar3 = uVar5;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    f[uVar1] = s_Truths6[pBSet[uVar5]];
    uVar1 = uVar1 + 1;
  }
  f[0] = If_ManSat6ComposeLut4((uint)uBound & 0xffff,f,(int)uVar1);
  for (lVar4 = 1; lVar4 - uVar6 != 1; lVar4 = lVar4 + 1) {
    f[lVar4] = s_Truths6[pSSet[lVar4 + -1]];
  }
  uVar1 = 0;
  uVar6 = (ulong)(uint)nFSet;
  if (nFSet < 1) {
    uVar6 = uVar1;
  }
  for (; uVar6 != uVar1; uVar1 = uVar1 + 1) {
    f[lVar4] = s_Truths6[pFSet[uVar1]];
    lVar4 = lVar4 + 1;
  }
  local_60 = (ushort)uFree;
  wVar2 = If_ManSat6ComposeLut4((uint)local_60,f,(int)lVar4);
  return wVar2;
}

Assistant:

word If_ManSat6Truth( word uBound, word uFree, int * pBSet, int nBSet, int * pSSet, int nSSet, int * pFSet, int nFSet )
{
    word r, q, f[4];
    int i, k = 0;
    // bound set vars
    for ( i = 0; i < nSSet; i++ )
        f[k++] = s_Truths6[pSSet[i]];
    for ( i = 0; i < nBSet; i++ )
        f[k++] = s_Truths6[pBSet[i]];
    q = If_ManSat6ComposeLut4( (int)(uBound & 0xffff), f, k );
    // free set vars
    k = 0;
    f[k++] = q;
    for ( i = 0; i < nSSet; i++ )
        f[k++] = s_Truths6[pSSet[i]];
    for ( i = 0; i < nFSet; i++ )
        f[k++] = s_Truths6[pFSet[i]];
    r = If_ManSat6ComposeLut4( (int)(uFree & 0xffff), f, k );
    return r;
}